

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::base::UnixSocket::SetTxTimeout(UnixSocket *this,uint32_t timeout_ms)

{
  _Base_ptr p_Var1;
  uint __fd;
  int iVar2;
  const_iterator __pos;
  _Base_ptr p_Var3;
  ulong *puVar4;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>>
  *this_00;
  timeval timeout;
  tuple<> tStack_21;
  _Head_base<0UL,_const_unsigned_long_&,_false> _Stack_20;
  ulong local_18;
  ulong uStack_10;
  
  (this->sock_raw_).tx_timeout_ms_ = timeout_ms;
  local_18 = (ulong)timeout_ms / 1000;
  uStack_10 = (ulong)((timeout_ms % 1000) * 1000);
  __fd = (this->sock_raw_).fd_.t_;
  this_00 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>>
             *)(ulong)__fd;
  puVar4 = (ulong *)0x1;
  _Stack_20._M_head_impl = (unsigned_long *)0x318bc3;
  iVar2 = setsockopt(__fd,1,0x15,&local_18,0x10);
  if (iVar2 == 0) {
    return;
  }
  _Stack_20._M_head_impl = (unsigned_long *)0x318bd1;
  SetTxTimeout();
  p_Var3 = *(_Base_ptr *)(this_00 + 0x10);
  p_Var1 = (_Base_ptr)(this_00 + 8);
  __pos._M_node = p_Var1;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(p_Var3 + 1) >= *puVar4) {
        __pos._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < *puVar4];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  if ((__pos._M_node == p_Var1) || (*puVar4 < *(ulong *)(__pos._M_node + 1))) {
    _Stack_20._M_head_impl = puVar4;
    ::std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>>
    ::
    _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
              (this_00,__pos,(piecewise_construct_t *)&::std::piecewise_construct,
               (tuple<const_unsigned_long_&> *)&_Stack_20,&tStack_21);
  }
  return;
}

Assistant:

void SetTxTimeout(uint32_t timeout_ms) {
    PERFETTO_CHECK(sock_raw_.SetTxTimeout(timeout_ms));
  }